

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall
wasm::
WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
::runOnFunction(WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                *this,Module *module,Function *func)

{
  PassRunner *pPVar1;
  Function *func_local;
  Module *module_local;
  WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  *this_local;
  
  pPVar1 = Pass::getPassRunner(&this->super_Pass);
  if (pPVar1 != (PassRunner *)0x0) {
    Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
    ::walkFunctionInModule
              (&(this->
                super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
                ).
                super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
               ,func,module);
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                ,0x214,
                "virtual void wasm::WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous namespace)::FieldInfo, wasm::(anonymous namespace)::FieldInfoScanner>>>::runOnFunction(Module *, Function *) [WalkerType = wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous namespace)::FieldInfo, wasm::(anonymous namespace)::FieldInfoScanner>>]"
               );
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    assert(getPassRunner());
    WalkerType::walkFunctionInModule(func, module);
  }